

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O2

void wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness::
     doVisitLocalSet(ParamLiveness*,wasm::Expression___(ParamLiveness *self,Expression **currp)

{
  BasicBlock *pBVar1;
  Expression *pEVar2;
  _Storage<wasm::Type,_true> _Var3;
  bool bVar4;
  LocalSet *pLVar5;
  Index *__args_1;
  Expression *pEVar6;
  optional<wasm::Type> type;
  Builder local_48;
  Block *local_40;
  Module *local_38;
  undefined8 local_30;
  Expression **local_28;
  
  pLVar5 = Expression::cast<wasm::LocalSet>(*currp);
  if (((self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
       super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
       currBasicBlock != (BasicBlock *)0x0) &&
     (bVar4 = Function::isParam((self->
                                super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                ).
                                super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                                .
                                super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                .super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                                currFunction,pLVar5->index), bVar4)) {
    local_28 = currp;
    pLVar5 = Expression::cast<wasm::LocalSet>(*currp);
    pBVar1 = (self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
             currBasicBlock;
    if (pBVar1 == (BasicBlock *)0x0) {
      bVar4 = LocalSet::isTee(pLVar5);
      if (bVar4) {
        _Var3 = (_Storage<wasm::Type,_true>)
                (pLVar5->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id
        ;
        local_40 = (Block *)pLVar5->value;
        if (_Var3 != (_Storage<wasm::Type,_true>)
                     (local_40->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                     type.id) {
          local_48.wasm =
               (self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule;
          local_38 = (Module *)&local_40;
          local_30 = 1;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 1;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = _Var3;
          local_40 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                               (&local_48,(initializer_list<wasm::Expression_*> *)&local_38,type);
        }
      }
      else {
        local_38 = (self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
                   super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                   .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                   super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule;
        local_40 = (Block *)Builder::makeDrop((Builder *)&local_38,pLVar5->value);
      }
      *currp = (Expression *)local_40;
    }
    else {
      local_38 = (Module *)CONCAT44(local_38._4_4_,1);
      __args_1 = &pLVar5->index;
      std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
      emplace_back<wasm::LivenessAction::What,unsigned_int&,wasm::Expression**&>
                ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
                 &(pBVar1->contents).actions,(What *)&local_38,__args_1,&local_28);
      pEVar2 = pLVar5->value;
      pEVar6 = pEVar2;
      if ((pEVar2->_id == LocalGetId) ||
         ((pEVar2->_id == IfId &&
          ((pEVar6 = (Expression *)pEVar2[1].type.id, pEVar6->_id == LocalGetId ||
           ((pEVar6 = *(Expression **)(pEVar2 + 2), pEVar6 != (Expression *)0x0 &&
            (pEVar6->_id == LocalGetId)))))))) {
        LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::addCopy
                  (&self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>,
                   *__args_1,*(Index *)(pEVar6 + 1));
        LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::addCopy
                  (&self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>,
                   *__args_1,*(Index *)(pEVar6 + 1));
      }
    }
  }
  return;
}

Assistant:

static void doVisitLocalSet(ParamLiveness* self, Expression** currp) {
      auto* set = (*currp)->cast<LocalSet>();
      if (self->currBasicBlock && self->getFunction()->isParam(set->index)) {
        Super::doVisitLocalSet(self, currp);
      }
    }